

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemanager.cpp
# Opt level: O0

GLuint __thiscall ResourceManager::getTexture(ResourceManager *this,string *filePath,bool *succes)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_40;
  _Base_ptr local_38;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  local_30;
  iterator it;
  bool *succes_local;
  string *filePath_local;
  ResourceManager *this_local;
  
  *succes = false;
  it._M_node = (_Base_ptr)succes;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::_Rb_tree_iterator(&local_30);
  local_38 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find(&this->loadedTextures,filePath);
  local_30._M_node = local_38;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::end(&this->loadedTextures);
  bVar1 = std::operator==(&local_30,&local_40);
  if (bVar1) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    *(undefined1 *)&(it._M_node)->_M_color = _S_black;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             ::operator->(&local_30);
    this_local._4_4_ = ppVar2->second;
  }
  return this_local._4_4_;
}

Assistant:

GLuint ResourceManager::getTexture(std::string filePath, bool& succes)
{
	succes = false;
	std::map<std::string, GLuint>::iterator it;
	it = loadedTextures.find(filePath);
	if (it == loadedTextures.end())
	{
		return -1;
	}
	else
	{
		succes = true;
		return it->second;
	}

}